

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

void aom_noise_strength_solver_add_measurement
               (aom_noise_strength_solver_t *solver,double block_mean,double noise_std)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = noise_strength_solver_get_bin_index(solver,block_mean);
  dVar7 = floor(dVar6);
  iVar3 = (int)dVar7;
  iVar4 = solver->num_bins;
  iVar2 = iVar4 + -1;
  if (iVar3 + 1 < iVar4) {
    iVar2 = iVar3 + 1;
  }
  dVar6 = dVar6 - (double)(int)dVar7;
  dVar7 = 1.0 - dVar6;
  pdVar1 = (solver->eqns).A;
  iVar5 = iVar4 * iVar3 + iVar3;
  pdVar1[iVar5] = dVar7 * dVar7 + pdVar1[iVar5];
  iVar5 = iVar2 * iVar4 + iVar3;
  pdVar1[iVar5] = pdVar1[iVar5] + dVar6 * dVar7;
  iVar5 = iVar2 * iVar4 + iVar2;
  pdVar1[iVar5] = dVar6 * dVar6 + pdVar1[iVar5];
  iVar4 = iVar4 * iVar3 + iVar2;
  pdVar1[iVar4] = dVar6 * dVar7 + pdVar1[iVar4];
  pdVar1 = (solver->eqns).b;
  pdVar1[iVar3] = dVar7 * noise_std + pdVar1[iVar3];
  pdVar1[iVar2] = dVar6 * noise_std + pdVar1[iVar2];
  solver->total = noise_std + solver->total;
  solver->num_equations = solver->num_equations + 1;
  return;
}

Assistant:

void aom_noise_strength_solver_add_measurement(
    aom_noise_strength_solver_t *solver, double block_mean, double noise_std) {
  const double bin = noise_strength_solver_get_bin_index(solver, block_mean);
  const int bin_i0 = (int)floor(bin);
  const int bin_i1 = AOMMIN(solver->num_bins - 1, bin_i0 + 1);
  const double a = bin - bin_i0;
  const int n = solver->num_bins;
  solver->eqns.A[bin_i0 * n + bin_i0] += (1.0 - a) * (1.0 - a);
  solver->eqns.A[bin_i1 * n + bin_i0] += a * (1.0 - a);
  solver->eqns.A[bin_i1 * n + bin_i1] += a * a;
  solver->eqns.A[bin_i0 * n + bin_i1] += a * (1.0 - a);
  solver->eqns.b[bin_i0] += (1.0 - a) * noise_std;
  solver->eqns.b[bin_i1] += a * noise_std;
  solver->total += noise_std;
  solver->num_equations++;
}